

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O3

ostream * std::operator<<(ostream *ofs,token *tok)

{
  long lVar1;
  long *plVar2;
  long *plVar3;
  long *plVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  local_70 = local_60;
  __cxx11::string::_M_construct<char_const*>((string *)&local_70,"\"","");
  local_50[0] = local_40;
  __cxx11::string::_M_construct<char*>((string *)local_50,local_70,local_68 + (long)local_70);
  std::__cxx11::string::_M_append((char *)local_50,(ulong)(tok->str_)._M_dataplus._M_p);
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)local_50,(ulong)local_70);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_80 = *plVar3;
    lStack_78 = plVar2[3];
    plVar4 = &local_80;
  }
  else {
    local_80 = *plVar3;
    plVar4 = (long *)*plVar2;
  }
  lVar1 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(ofs,(char *)plVar4,lVar1);
  if (plVar4 != &local_80) {
    operator_delete(plVar4,local_80 + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  return ofs;
}

Assistant:

std::ostream &operator<<(std::ostream &ofs, const tinyusdz::value::token &tok) {
  ofs << tinyusdz::quote(tok.str());

  return ofs;
}